

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilterBase.cpp
# Opt level: O1

void __thiscall
UnscentedKalmanFilterBase_computeSigmaWeights_Test::TestBody
          (UnscentedKalmanFilterBase_computeSigmaWeights_Test *this)

{
  T *pTVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  undefined1 local_100 [8];
  ConcreteUKF<Kalman::Vector<float,_3>_> ukf;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0x13] = 1.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0x14] = 2.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.alpha = 1.0;
  Kalman::UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>::computeWeights
            ((UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_> *)local_100);
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
  super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.super_Matrix<float,_3,_1>.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  local_100._0_4_ = 0.0;
  local_100._4_4_ = 0.0;
  Kalman::UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>::computeWeights
            ((UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_> *)local_100);
  pTVar1 = &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda;
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)pTVar1,"2","ukf.gamma",2.0,
             ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.beta);
  if (ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
               ,0x26,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
      local_38.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)pTVar1,"1","ukf.lambda",1.0,
               ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.kappa);
    if (ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda._0_1_ == '\0') {
      testing::Message::Message((Message *)&local_38);
      if (gtest_ar._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                 ,0x27,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      if (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_38.ptr_ + 8))();
        }
        local_38.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)pTVar1,"0.25","ukf.sigmaWeights_m[0]",0.25,
                 ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                 super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.super_Matrix<float,_3,_1>.
                 super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [1]);
      if (ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda._0_1_ == '\0') {
        testing::Message::Message((Message *)&local_38);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                   ,0x29,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
        if (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_38.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_38.ptr_ + 8))();
          }
          local_38.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperFloatingPointEQ<float>
                  ((internal *)pTVar1,"2.25","ukf.sigmaWeights_c[0]",2.25,
                   ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_m.
                   super_Matrix<float,_7,_1>.
                   super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.m_data.
                   array[5]);
        if (ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda._0_1_ == '\0') {
          testing::Message::Message((Message *)&local_38);
          if (gtest_ar._0_8_ == 0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                     ,0x2a,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
          if (local_38.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_38.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_38.ptr_ + 8))();
            }
            local_38.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          lVar3 = -0x18;
          pTVar1 = &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda;
          do {
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)pTVar1,"0.125","ukf.sigmaWeights_c[i]",0.125,
                       *(float *)((long)&ukf.
                                         super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                         sigmaWeights_c.super_Matrix<float,_7,_1>.
                                         super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>
                                         .m_storage.m_data + lVar3 + 0x14));
            if (ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda._0_1_ == '\0')
            {
              testing::Message::Message((Message *)&local_38);
              if (gtest_ar._0_8_ == 0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                         ,0x2e,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
              if (local_38.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar2 = testing::internal::IsTrue(true);
                if ((bVar2) &&
                   (local_38.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_38.ptr_ + 8))();
                }
                local_38.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              return;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)pTVar1,"0.125","ukf.sigmaWeights_m[i]",0.125,
                       *(float *)((long)&ukf.
                                         super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                         sigmaWeights_m.super_Matrix<float,_7,_1>.
                                         super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>
                                         .m_storage.m_data + lVar3 + 0x14));
            if (ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda._0_1_ == '\0')
            {
              testing::Message::Message((Message *)&local_38);
              if (gtest_ar._0_8_ == 0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                         ,0x2f,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
              if (local_38.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar2 = testing::internal::IsTrue(true);
                if ((bVar2) &&
                   (local_38.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_38.ptr_ + 8))();
                }
                local_38.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              return;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            lVar3 = lVar3 + 4;
          } while (lVar3 != 0);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(UnscentedKalmanFilterBase, computeSigmaWeights) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = ConcreteUKF<Vector<T, 3>>(alpha,beta,kappa);
    ukf.computeWeights();
    
    ASSERT_FLOAT_EQ(2, ukf.gamma);
    ASSERT_FLOAT_EQ(1, ukf.lambda);
    
    ASSERT_FLOAT_EQ(0.25, ukf.sigmaWeights_m[0]);
    ASSERT_FLOAT_EQ(2.25, ukf.sigmaWeights_c[0]);
    
    for(size_t i = 1; i < 7; i++)
    {
        ASSERT_FLOAT_EQ(0.125, ukf.sigmaWeights_c[i]);
        ASSERT_FLOAT_EQ(0.125, ukf.sigmaWeights_m[i]);
    }
}